

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

void tdefl_optimize_huffman_table
               (tdefl_compressor *d,int table_num,int table_len,int code_size_limit,int static_table
               )

{
  int iVar1;
  mz_uint8 *pmVar2;
  byte bVar3;
  mz_uint16 mVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [64];
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint *puVar18;
  ushort *puVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ushort uVar23;
  ushort *puVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ushort *puVar28;
  ulong uVar29;
  bool bVar30;
  ushort uVar31;
  ulong uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  int num_codes [33];
  mz_uint next_code [33];
  tdefl_sym_freq syms0 [288];
  tdefl_sym_freq syms1 [288];
  undefined1 auStack_1604 [4];
  undefined8 uStack_1600;
  int local_15ec;
  long local_15e8;
  long local_15e0;
  ulong local_15d8;
  undefined8 local_15d0;
  undefined1 local_15c8 [64];
  undefined1 local_1588 [64];
  undefined4 local_1548;
  uint local_1538 [256];
  int local_1138 [256];
  ushort local_d38 [576];
  uint auStack_8b8 [256];
  ushort local_4b8 [580];
  
  uVar13 = (ulong)(uint)code_size_limit;
  local_1548 = 0;
  uVar22 = (ulong)(uint)table_num;
  uVar29 = (ulong)(uint)table_len;
  local_15c8 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_1588 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_15d0 = uVar22;
  if (static_table != 0) {
    if (0 < table_len) {
      uVar11 = 0;
      do {
        pmVar2 = d->m_huff_code_sizes[uVar22] + uVar11;
        uVar11 = uVar11 + 1;
        *(int *)(local_15c8 + (ulong)*pmVar2 * 4) = *(int *)(local_15c8 + (ulong)*pmVar2 * 4) + 1;
      } while (uVar29 != uVar11);
    }
    goto LAB_00132355;
  }
  local_15e8 = uVar22 * 0x240;
  local_15ec = table_len;
  if (table_len < 1) {
    uStack_1600 = 0x131eeb;
    memset(local_1538,0,0x800);
LAB_00131eeb:
    uVar11 = 0;
    bVar30 = true;
    local_1138[0] = 0;
  }
  else {
    uVar11 = 0;
    uVar17 = 0;
    do {
      mVar4 = d->m_huff_count[uVar22][uVar11];
      if (mVar4 != 0) {
        lVar12 = (long)(int)uVar17;
        uVar17 = uVar17 + 1;
        *(mz_uint16 *)(auStack_8b8 + lVar12 + -0x120) = mVar4;
        *(short *)((long)auStack_8b8 + lVar12 * 4 + -0x47e) = (short)uVar11;
      }
      uVar11 = uVar11 + 1;
    } while (uVar29 != uVar11);
    uStack_1600 = 0x131e93;
    memset(local_1538,0,0x800);
    bVar30 = uVar17 == 0;
    if (bVar30) goto LAB_00131eeb;
    uVar11 = 0;
    do {
      uVar21 = auStack_8b8[uVar11 - 0x120];
      uVar11 = uVar11 + 1;
      local_1538[(byte)(ushort)uVar21] = local_1538[(byte)(ushort)uVar21] + 1;
      local_1138[(ushort)((ushort)uVar21 >> 8)] = local_1138[(ushort)((ushort)uVar21 >> 8)] + 1;
    } while (uVar17 != uVar11);
    uVar11 = (ulong)uVar17;
  }
  iVar10 = (int)uVar11;
  local_15e0 = uVar22 * 9;
  local_15d8 = uVar13;
  uVar13 = local_15d8;
  lVar12 = 2;
  bVar9 = local_1138[0] == iVar10;
  do {
    bVar8 = bVar9;
    lVar27 = lVar12;
    uVar17 = 0;
    lVar12 = 1;
    bVar9 = false;
  } while (bVar8);
  puVar18 = local_1538;
  lVar12 = 0;
  puVar19 = local_4b8;
  puVar28 = local_d38;
  do {
    puVar24 = puVar19;
    lVar25 = 0;
    uVar21 = 0;
    do {
      auStack_8b8[lVar25] = uVar21;
      uVar21 = uVar21 + puVar18[lVar25];
      lVar25 = lVar25 + 1;
    } while (lVar25 != 0x100);
    if (!bVar30) {
      uVar26 = 0;
      do {
        uVar16 = puVar28[uVar26 * 2] >> (uVar17 & 0x1f) & 0xff;
        uVar21 = auStack_8b8[uVar16];
        auStack_8b8[uVar16] = uVar21 + 1;
        lVar25 = uVar26 * 2;
        uVar26 = uVar26 + 1;
        *(undefined4 *)(puVar24 + (ulong)uVar21 * 2) = *(undefined4 *)(puVar28 + lVar25);
      } while (uVar11 != uVar26);
    }
    lVar12 = lVar12 + 1;
    uVar17 = uVar17 + 8;
    puVar18 = puVar18 + 0x100;
    puVar19 = puVar28;
    puVar28 = puVar24;
  } while (lVar12 != lVar27);
  if (iVar10 != 0) {
    if (iVar10 == 1) {
      *puVar24 = 1;
    }
    else {
      *puVar24 = *puVar24 + puVar24[2];
      uVar17 = iVar10 - 1;
      if (iVar10 < 3) {
        puVar24[(long)iVar10 * 2 + -4] = 0;
      }
      else {
        iVar15 = 2;
        uVar26 = 1;
        iVar20 = 0;
        do {
          lVar12 = (long)iVar20;
          if ((iVar15 < iVar10) &&
             (lVar27 = (long)iVar15, puVar24[lVar27 * 2] <= puVar24[lVar12 * 2])) {
            iVar15 = iVar15 + 1;
            puVar24[uVar26 * 2] = puVar24[lVar27 * 2];
          }
          else {
            iVar20 = iVar20 + 1;
            puVar24[uVar26 * 2] = puVar24[lVar12 * 2];
            puVar24[lVar12 * 2] = (ushort)uVar26;
            lVar12 = (long)iVar20;
          }
          if (iVar15 < iVar10) {
            if (lVar12 < (long)uVar26) {
              uVar31 = puVar24[lVar12 * 2];
              uVar23 = puVar24[(long)iVar15 * 2];
              if (uVar31 < uVar23) goto LAB_0013204b;
            }
            else {
              uVar23 = puVar24[(long)iVar15 * 2];
            }
            puVar24[uVar26 * 2] = puVar24[uVar26 * 2] + uVar23;
            iVar15 = iVar15 + 1;
          }
          else {
            uVar31 = puVar24[lVar12 * 2];
LAB_0013204b:
            puVar24[uVar26 * 2] = puVar24[uVar26 * 2] + uVar31;
            iVar20 = iVar20 + 1;
            puVar24[lVar12 * 2] = (ushort)uVar26;
          }
          uVar26 = uVar26 + 1;
        } while (uVar17 != uVar26);
        puVar24[(long)iVar10 * 2 + -4] = 0;
        uVar26 = (ulong)(iVar10 - 3);
        do {
          puVar24[uVar26 * 2] = puVar24[(ulong)puVar24[uVar26 * 2] * 2] + 1;
          bVar30 = uVar26 != 0;
          uVar26 = uVar26 - 1;
        } while (bVar30);
      }
      uVar21 = iVar10 - 2;
      iVar15 = 1;
      uVar16 = 0;
      do {
        if ((int)uVar21 < 0) {
          iVar20 = 0;
        }
        else {
          iVar1 = uVar21 + 1;
          iVar20 = 0;
          do {
            if (uVar16 != puVar24[(ulong)uVar21 * 2]) goto LAB_001320e4;
            iVar20 = iVar20 + 1;
            uVar21 = uVar21 - 1;
          } while (iVar1 != iVar20);
          uVar21 = 0xffffffff;
          iVar20 = iVar1;
        }
LAB_001320e4:
        if (iVar20 < iVar15) {
          puVar19 = puVar24 + (long)(int)uVar17 * 2;
          uVar17 = (uVar17 + iVar20) - iVar15;
          do {
            *puVar19 = (ushort)uVar16;
            iVar15 = iVar15 + -1;
            puVar19 = puVar19 + -2;
          } while (iVar20 < iVar15);
        }
        iVar15 = iVar20 * 2;
        uVar16 = uVar16 + 1;
      } while (iVar20 != 0);
      if (iVar10 < 1) goto LAB_001322a4;
    }
    uVar26 = 0;
    do {
      lVar12 = uVar26 * 2;
      uVar26 = uVar26 + 1;
      *(int *)(local_15c8 + (ulong)puVar24[lVar12] * 4) =
           *(int *)(local_15c8 + (ulong)puVar24[lVar12] * 4) + 1;
    } while (uVar11 != uVar26);
    if (1 < iVar10) {
      if (code_size_limit < 0x20) {
        iVar10 = *(int *)(local_15c8 + uVar13 * 4);
        lVar12 = (long)code_size_limit;
        do {
          iVar10 = iVar10 + *(int *)(local_15c8 + lVar12 * 4 + 4);
          lVar12 = lVar12 + 1;
          *(int *)(local_15c8 + uVar13 * 4) = iVar10;
        } while (lVar12 != 0x20);
        if (0 < code_size_limit) goto LAB_0013215f;
        uVar17 = 0;
      }
      else {
LAB_0013215f:
        auVar34 = vpbroadcastd_avx512f();
        auVar35 = vpaddd_avx512f(auVar34,_DAT_0015d540);
        auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar38 = vpbroadcastd_avx512f(ZEXT416(0xfffffff0));
        pauVar14 = (undefined1 (*) [64])(auStack_1604 + uVar13 * 4);
        auVar43 = ZEXT1664((undefined1  [16])0x0);
        auVar39 = vpbroadcastq_avx512f();
        uVar26 = 0;
        do {
          auVar40 = vpbroadcastq_avx512f();
          uVar26 = uVar26 + 0x10;
          auVar41 = vporq_avx512f(auVar40,auVar36);
          auVar40 = vporq_avx512f(auVar40,auVar37);
          uVar7 = vpcmpuq_avx512f(auVar41,auVar39,2);
          bVar3 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar40,auVar39,2);
          auVar40 = vpsubd_avx512f(auVar34,auVar35);
          auVar35 = vpaddd_avx512f(auVar35,auVar38);
          uVar31 = CONCAT11(bVar3,(byte)uVar7);
          auVar41 = vpmovm2d_avx512dq((ulong)uVar31);
          auVar41 = vpshufd_avx512f(auVar41,0x1b);
          auVar41 = vshufi64x2_avx512f(auVar41,auVar41,0x1b);
          uVar32 = vpmovd2m_avx512dq(auVar41);
          auVar41 = vmovdqu32_avx512f(*pauVar14);
          auVar42._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar41._4_4_;
          auVar42._0_4_ = (uint)((byte)uVar32 & 1) * auVar41._0_4_;
          auVar42._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar41._8_4_;
          auVar42._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar41._12_4_;
          auVar42._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar41._16_4_;
          auVar42._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar41._20_4_;
          auVar42._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar41._24_4_;
          auVar42._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar41._28_4_;
          auVar42._32_4_ = (uint)((byte)(uVar32 >> 8) & 1) * auVar41._32_4_;
          auVar42._36_4_ = (uint)((byte)(uVar32 >> 9) & 1) * auVar41._36_4_;
          auVar42._40_4_ = (uint)((byte)(uVar32 >> 10) & 1) * auVar41._40_4_;
          auVar42._44_4_ = (uint)((byte)(uVar32 >> 0xb) & 1) * auVar41._44_4_;
          auVar42._48_4_ = (uint)((byte)(uVar32 >> 0xc) & 1) * auVar41._48_4_;
          auVar42._52_4_ = (uint)((byte)(uVar32 >> 0xd) & 1) * auVar41._52_4_;
          auVar42._56_4_ = (uint)((byte)(uVar32 >> 0xe) & 1) * auVar41._56_4_;
          auVar42._60_4_ = (uint)((byte)(uVar32 >> 0xf) & 1) * auVar41._60_4_;
          pauVar14 = pauVar14 + -1;
          auVar41 = vpshufd_avx512f(auVar42,0x1b);
          auVar41 = vshufi64x2_avx512f(auVar41,auVar41,0x1b);
          auVar40 = vpsllvd_avx512f(auVar41,auVar40);
          auVar41 = vmovdqa64_avx512f(auVar43);
          auVar43 = vpaddd_avx512f(auVar40,auVar43);
        } while ((uVar13 + (code_size_limit == 0) + 0xf & 0xfffffffffffffff0) != uVar26);
        auVar34 = vmovdqa32_avx512f(auVar43);
        bVar30 = (bool)((byte)uVar7 & 1);
        auVar35._0_4_ = (uint)bVar30 * auVar34._0_4_ | (uint)!bVar30 * auVar41._0_4_;
        bVar30 = (bool)((byte)(uVar31 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar30 * auVar34._4_4_ | (uint)!bVar30 * auVar41._4_4_;
        bVar30 = (bool)((byte)(uVar31 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar30 * auVar34._8_4_ | (uint)!bVar30 * auVar41._8_4_;
        bVar30 = (bool)((byte)(uVar31 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar30 * auVar34._12_4_ | (uint)!bVar30 * auVar41._12_4_;
        bVar30 = (bool)((byte)(uVar31 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar30 * auVar34._16_4_ | (uint)!bVar30 * auVar41._16_4_;
        bVar30 = (bool)((byte)(uVar31 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar30 * auVar34._20_4_ | (uint)!bVar30 * auVar41._20_4_;
        bVar30 = (bool)((byte)(uVar31 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar30 * auVar34._24_4_ | (uint)!bVar30 * auVar41._24_4_;
        bVar30 = (bool)((byte)(uVar31 >> 7) & 1);
        auVar35._28_4_ = (uint)bVar30 * auVar34._28_4_ | (uint)!bVar30 * auVar41._28_4_;
        auVar35._32_4_ =
             (uint)(bVar3 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar3 & 1) * auVar41._32_4_;
        bVar30 = (bool)(bVar3 >> 1 & 1);
        auVar35._36_4_ = (uint)bVar30 * auVar34._36_4_ | (uint)!bVar30 * auVar41._36_4_;
        bVar30 = (bool)(bVar3 >> 2 & 1);
        auVar35._40_4_ = (uint)bVar30 * auVar34._40_4_ | (uint)!bVar30 * auVar41._40_4_;
        bVar30 = (bool)(bVar3 >> 3 & 1);
        auVar35._44_4_ = (uint)bVar30 * auVar34._44_4_ | (uint)!bVar30 * auVar41._44_4_;
        bVar30 = (bool)(bVar3 >> 4 & 1);
        auVar35._48_4_ = (uint)bVar30 * auVar34._48_4_ | (uint)!bVar30 * auVar41._48_4_;
        bVar30 = (bool)(bVar3 >> 5 & 1);
        auVar35._52_4_ = (uint)bVar30 * auVar34._52_4_ | (uint)!bVar30 * auVar41._52_4_;
        bVar30 = (bool)(bVar3 >> 6 & 1);
        auVar35._56_4_ = (uint)bVar30 * auVar34._56_4_ | (uint)!bVar30 * auVar41._56_4_;
        auVar35._60_4_ =
             (uint)(bVar3 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar3 >> 7) * auVar41._60_4_;
        auVar33 = vextracti64x4_avx512f(auVar35,1);
        auVar34 = vpaddd_avx512f(auVar35,ZEXT3264(auVar33));
        auVar5 = vpaddd_avx(auVar34._0_16_,auVar34._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpaddd_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpaddd_avx(auVar5,auVar6);
        uVar17 = auVar5._0_4_;
      }
      for (; 1L << (uVar13 & 0x3f) != (ulong)uVar17; uVar17 = uVar17 - 1) {
        *(int *)(local_15c8 + uVar13 * 4) = *(int *)(local_15c8 + uVar13 * 4) + -1;
        uVar26 = uVar13;
        do {
          if ((long)uVar26 < 2) goto LAB_0013229d;
          lVar12 = uVar26 * 4;
          uVar26 = uVar26 - 1;
        } while (*(int *)(local_15c8 + lVar12 + -4) == 0);
        *(int *)(local_15c8 + uVar26 * 4) = *(int *)(local_15c8 + lVar12 + -4) + -1;
        *(int *)(local_15c8 + (ulong)((int)uVar26 + 1U & 0x7fffffff) * 4) =
             *(int *)(local_15c8 + (ulong)((int)uVar26 + 1U & 0x7fffffff) * 4) + 2;
LAB_0013229d:
      }
    }
  }
LAB_001322a4:
  auVar35 = ZEXT1664((undefined1  [16])0x0);
  auVar34 = vmovdqu64_avx512f(auVar35);
  *(undefined1 (*) [64])(d->m_huff_code_sizes[uVar22] + 0xe0) = auVar34;
  auVar34 = vmovdqu64_avx512f(auVar35);
  *(undefined1 (*) [64])(d->m_huff_code_sizes[uVar22] + 0xc0) = auVar34;
  auVar34 = vmovdqu64_avx512f(auVar35);
  *(undefined1 (*) [64])(d->m_huff_code_sizes[uVar22] + 0x80) = auVar34;
  auVar34 = vmovdqu64_avx512f(auVar35);
  *(undefined1 (*) [64])(d->m_huff_code_sizes[uVar22] + 0x40) = auVar34;
  auVar34 = vmovdqu64_avx512f(auVar35);
  *(undefined1 (*) [64])d->m_huff_code_sizes[uVar22] = auVar34;
  uStack_1600 = 0x1322ff;
  memset((void *)((long)d->m_huff_codes[0] + local_15e8),0,0x240);
  table_len = local_15ec;
  if (0 < code_size_limit) {
    uVar26 = 1;
    do {
      iVar10 = *(int *)(local_15c8 + uVar26 * 4);
      if (0 < iVar10) {
        puVar19 = puVar24 + (long)(int)uVar11 * 2 + -1;
        uVar11 = (ulong)(uint)((int)uVar11 - iVar10);
        uVar17 = iVar10 + 1;
        do {
          uVar31 = *puVar19;
          puVar19 = puVar19 + -2;
          uVar17 = uVar17 - 1;
          d->m_huff_code_sizes[uVar22][uVar31] = (mz_uint8)uVar26;
        } while (1 < uVar17);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != code_size_limit + 1);
  }
LAB_00132355:
  local_1538[1] = 0;
  if (1 < (int)uVar13) {
    lVar12 = 0;
    uVar17 = 0;
    do {
      uVar17 = (uVar17 + *(int *)(local_15c8 + lVar12 * 4 + 4)) * 2;
      local_1538[lVar12 + 2] = uVar17;
      lVar12 = lVar12 + 1;
    } while (uVar13 - 1 != lVar12);
  }
  if (0 < table_len) {
    uVar13 = 0;
    do {
      bVar3 = d->m_huff_code_sizes[local_15d0][uVar13];
      if (bVar3 != 0) {
        uVar21 = (uint)bVar3;
        uVar17 = local_1538[uVar21];
        uVar16 = uVar21 + 1;
        local_1538[uVar21] = uVar17 + 1;
        iVar10 = 0;
        do {
          uVar21 = uVar17 & 1;
          uVar17 = uVar17 >> 1;
          uVar16 = uVar16 - 1;
          iVar10 = uVar21 + iVar10 * 2;
        } while (1 < uVar16);
        d->m_huff_codes[local_15d0][uVar13] = (mz_uint16)iVar10;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar29);
  }
  return;
}

Assistant:

static void
tdefl_optimize_huffman_table(tdefl_compressor* d, int table_num, int table_len, int code_size_limit, int static_table) {

    int i, j, l, num_codes[1 + TDEFL_MAX_SUPPORTED_HUFF_CODESIZE];
    mz_uint next_code[TDEFL_MAX_SUPPORTED_HUFF_CODESIZE + 1];
    MZ_CLEAR_OBJ(num_codes);
    if (static_table) {
        for (i = 0; i < table_len; i++)
            num_codes[d->m_huff_code_sizes[table_num][i]]++;
    }
    else {
        tdefl_sym_freq syms0[TDEFL_MAX_HUFF_SYMBOLS], syms1[TDEFL_MAX_HUFF_SYMBOLS], * pSyms;
        int num_used_syms = 0;
        const mz_uint16* pSym_count = &d->m_huff_count[table_num][0];
        for (i = 0; i < table_len; i++)
            if (pSym_count[i]) {
                syms0[num_used_syms].m_key = (mz_uint16)pSym_count[i];
                syms0[num_used_syms++].m_sym_index = (mz_uint16)i;
            }

        pSyms = tdefl_radix_sort_syms(num_used_syms, syms0, syms1);
        tdefl_calculate_minimum_redundancy(pSyms, num_used_syms);

        for (i = 0; i < num_used_syms; i++)
            num_codes[pSyms[i].m_key]++;

        tdefl_huffman_enforce_max_code_size(num_codes, num_used_syms, code_size_limit);

        MZ_CLEAR_OBJ(d->m_huff_code_sizes[table_num]);
        MZ_CLEAR_OBJ(d->m_huff_codes[table_num]);
        for (i = 1, j = num_used_syms; i <= code_size_limit; i++)
            for (l = num_codes[i]; l > 0; l--)
                d->m_huff_code_sizes[table_num][pSyms[--j].m_sym_index] = (mz_uint8)(i);
    }

    next_code[1] = 0;
    for (j = 0, i = 2; i <= code_size_limit; i++)
        next_code[i] = j = ((j + num_codes[i - 1]) << 1);

    for (i = 0; i < table_len; i++) {
        mz_uint rev_code = 0, code, code_size;
        if ((code_size = d->m_huff_code_sizes[table_num][i]) == 0)
            continue;
        code = next_code[code_size]++;
        for (l = code_size; l > 0; l--, code >>= 1)
            rev_code = (rev_code << 1) | (code & 1);
        d->m_huff_codes[table_num][i] = (mz_uint16)rev_code;
    }
}